

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O3

size_t __thiscall
libtorrent::aux::utp_stream::write_some<boost::asio::const_buffer>
          (utp_stream *this,const_buffer *buffers,error_code *ec)

{
  bool bVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    uVar2 = 0x10000006b;
  }
  else {
    bVar1 = check_fin_sent(this);
    if (bVar1) {
      uVar2 = 0x100000020;
    }
    else {
      if (buffers->size_ == 0) {
        sVar4 = write_some(this,true);
        return sVar4;
      }
      add_write_buffer(this,buffers->data_,(int)buffers->size_);
      sVar4 = buffers->size_;
      sVar3 = write_some(this,true);
      if (sVar3 != 0) {
        return sVar3;
      }
      if (sVar4 == 0) {
        return 0;
      }
      uVar2 = 0x10000000b;
    }
  }
  ec->val_ = (int)uVar2;
  ec->failed_ = (bool)(char)((ulong)uVar2 >> 0x20);
  *(int3 *)&ec->field_0x5 = (int3)((ulong)uVar2 >> 0x28);
  ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  return 0;
}

Assistant:

std::size_t write_some(Const_Buffers const& buffers, error_code& ec)
	{
		TORRENT_ASSERT(!m_write_handler);
		if (m_impl == nullptr)
		{
			ec = boost::asio::error::not_connected;
			return 0;
		}

		if (check_fin_sent())
		{
			// we can't send more data after closing the socket
			ec = boost::asio::error::broken_pipe;
			return 0;
		}

		size_t buf_size = 0;

		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_write_buffer(i->data(), int(i->size()));
			buf_size += i->size();
		}
		std::size_t ret = write_some(true);
		TORRENT_ASSERT(ret <= buf_size);
		if (ret == 0 && buf_size > 0)
		{
			ec = boost::asio::error::would_block;
			return 0;
		}
		return ret;
	}